

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEdit::QTextEdit(QTextEdit *this,QWidget *parent)

{
  QTextEditPrivate *this_00;
  QAbstractScrollArea *in_RSI;
  QTextEditPrivate *in_RDI;
  long in_FS_OFFSET;
  QTextEditPrivate *d;
  QWidget *in_stack_ffffffffffffffc0;
  EVP_PKEY_CTX *ctx;
  QAbstractScrollAreaPrivate *in_stack_ffffffffffffffc8;
  EVP_PKEY_CTX local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  operator_new(0x3c8);
  QTextEditPrivate::QTextEditPrivate(in_RDI);
  QAbstractScrollArea::QAbstractScrollArea
            (in_RSI,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  *(undefined ***)
   &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate =
       &PTR_metaObject_00d1dad8;
  *(undefined ***)
   &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.field_0x10 =
       &PTR__QTextEdit_00d1dcd8;
  this_00 = d_func((QTextEdit *)0x6d10e8);
  ctx = local_20;
  QString::QString((QString *)0x6d1106);
  QTextEditPrivate::init(this_00,ctx);
  QString::~QString((QString *)0x6d111f);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTextEdit::QTextEdit(QWidget *parent)
    : QAbstractScrollArea(*new QTextEditPrivate, parent)
{
    Q_D(QTextEdit);
    d->init();
}